

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.cpp
# Opt level: O1

void obme::obme_init(void)

{
  unsigned_long_long uVar1;
  
  uVar1 = time((time_t *)0x0);
  init_genrand64(uVar1);
  _OBME_MASK = (unsigned_long_long *)operator_new(8);
  *_OBME_MASK = 0;
  *_OBME_MASK = 0;
  do {
    uVar1 = genrand64_int64();
    *_OBME_MASK = uVar1;
  } while (uVar1 == 0);
  return;
}

Assistant:

void obme_init()
	{
		// Init random generator
		init_genrand64(time(NULL));
		
		// Allocates the mask in the heap because of security reasons.
		_OBME_MASK = new obme_t();
		*_OBME_MASK = 0;
		
		do {
			*_OBME_MASK = genrand64_int64();
			
		// almost impossible, 5.42 * 10^-20
		} while(*_OBME_MASK == 0);
		
		// printf("%llX\n", *_OBME_MASK);
	}